

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int bio_wait(BIO *bio,time_t max_time,uint nap_milliseconds)

{
  long lVar1;
  time_t tVar2;
  uint in_EDX;
  long in_RSI;
  BIO *in_RDI;
  long sec_diff;
  int fd;
  time_t in_stack_00000090;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int local_20;
  uint local_1c;
  long local_18;
  BIO *local_10;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    lVar1 = BIO_ctrl(in_RDI,0x69,0,&local_20);
    if ((lVar1 < 1) || (0x3ff < local_20)) {
      tVar2 = time((time_t *)0x0);
      local_18 = local_18 - tVar2;
      if (local_18 < 0) {
        local_4 = 0;
      }
      else {
        if (local_18 == 0) {
          if (1000 < local_1c) {
            local_1c = 1000;
          }
        }
        else if ((ulong)(local_18 * 1000) < (ulong)local_1c) {
          local_1c = (int)local_18 * 1000;
        }
        ossl_sleep(0x21c56c);
        local_4 = 1;
      }
    }
    else {
      BIO_test_flags(local_10,1);
      local_4 = BIO_socket_wait(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
    }
  }
  return local_4;
}

Assistant:

static int bio_wait(BIO *bio, time_t max_time, unsigned int nap_milliseconds)
{
#ifndef OPENSSL_NO_SOCK
    int fd;
#endif
    long sec_diff;

    if (max_time == 0) /* no timeout */
        return 1;

#ifndef OPENSSL_NO_SOCK
    if (BIO_get_fd(bio, &fd) > 0 && fd < FD_SETSIZE)
        return BIO_socket_wait(fd, BIO_should_read(bio), max_time);
#endif
    /* fall back to polling since no sockets are available */

    sec_diff = (long)(max_time - time(NULL)); /* might overflow */
    if (sec_diff < 0)
        return 0; /* clearly timeout */

    /* now take a nap at most the given number of milliseconds */
    if (sec_diff == 0) { /* we are below the 1 seconds resolution of max_time */
        if (nap_milliseconds > 1000)
            nap_milliseconds = 1000;
    } else { /* for sec_diff > 0, take min(sec_diff * 1000, nap_milliseconds) */
        if ((unsigned long)sec_diff * 1000 < nap_milliseconds)
            nap_milliseconds = (unsigned int)sec_diff * 1000;
    }
    ossl_sleep(nap_milliseconds);
    return 1;
}